

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_compress.c
# Opt level: O2

void deflate_make_huffman_code
               (uint num_syms,uint max_codeword_len,u32 *freqs,u8 *lens,u32 *codewords)

{
  u32 *puVar1;
  byte bVar2;
  u8 uVar3;
  u8 uVar4;
  u32 uVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  bool bVar20;
  uint len_counts [16];
  uint local_4b8 [290];
  
  uVar12 = (ulong)num_syms;
  memset(local_4b8,0,uVar12 * 4);
  uVar13 = num_syms - 1;
  uVar18 = (ulong)uVar13;
  for (uVar19 = 0; uVar12 != uVar19; uVar19 = uVar19 + 1) {
    uVar8 = (ulong)freqs[uVar19];
    if (uVar13 <= freqs[uVar19]) {
      uVar8 = uVar18;
    }
    local_4b8[uVar8] = local_4b8[uVar8] + 1;
  }
  uVar14 = 0;
  for (uVar19 = 1; uVar19 < uVar12; uVar19 = uVar19 + 1) {
    uVar16 = local_4b8[uVar19];
    local_4b8[uVar19] = uVar14;
    uVar14 = uVar16 + uVar14;
  }
  for (uVar19 = 0; uVar12 != uVar19; uVar19 = uVar19 + 1) {
    uVar16 = freqs[uVar19];
    if (uVar16 == 0) {
      lens[uVar19] = '\0';
    }
    else {
      uVar8 = (ulong)uVar16;
      if (uVar13 <= uVar16) {
        uVar8 = uVar18;
      }
      uVar9 = local_4b8[uVar8];
      local_4b8[uVar8] = uVar9 + 1;
      codewords[uVar9] = (uint)uVar19 | uVar16 << 10;
    }
  }
  uVar13 = local_4b8[num_syms - 2];
  puVar1 = codewords + uVar13;
  uVar9 = local_4b8[uVar18] - uVar13;
  uVar16 = uVar9 >> 1;
  while (uVar16 != 0) {
    heapify_subtree(codewords + ((ulong)uVar13 - 1),uVar9,uVar16);
    uVar16 = uVar16 - 1;
  }
  uVar18 = (ulong)uVar9;
  while (1 < uVar18) {
    uVar5 = puVar1[uVar18 - 1];
    puVar1[uVar18 - 1] = *puVar1;
    *puVar1 = uVar5;
    uVar18 = uVar18 - 1;
    heapify_subtree(codewords + ((ulong)uVar13 - 1),(uint)uVar18,1);
  }
  if (uVar14 < 2) {
    if (uVar14 == 0) {
      uVar13 = 0;
    }
    else {
      uVar13 = *codewords & 0x3ff;
    }
    uVar13 = uVar13 + (uVar13 == 0);
    *codewords = 0;
    *lens = '\x01';
    codewords[uVar13] = 1;
    lens[uVar13] = '\x01';
  }
  else {
    uVar13 = uVar14 - 1;
    iVar7 = 0;
    uVar19 = 0;
    uVar16 = 0;
    uVar18 = 0;
    do {
      uVar9 = uVar16 + 1;
      iVar15 = (int)uVar18;
      if ((uVar13 < uVar9) ||
         ((uVar19 != uVar18 && ((codewords[uVar18] & 0xfffffc00) < (codewords[uVar9] & 0xfffffc00)))
         )) {
        if (uVar19 < iVar15 + 2) {
          uVar17 = codewords[uVar16] & 0xfffffc00;
          uVar8 = (ulong)(iVar15 + 1);
        }
        else {
          uVar8 = (ulong)(iVar15 + 1);
          uVar6 = codewords[uVar8];
          uVar11 = uVar6 & 0xfffffc00;
          if ((uVar13 < uVar16) || (uVar17 = codewords[uVar16] & 0xfffffc00, uVar11 < uVar17)) {
            uVar17 = uVar11 + (codewords[uVar18] & 0xfffffc00);
            codewords[uVar18] = (codewords[uVar18] & 0x3ff) + iVar7;
            codewords[uVar8] = (uVar6 & 0x3ff) + iVar7;
            uVar18 = (ulong)(iVar15 + 2);
            goto LAB_00107852;
          }
        }
        uVar17 = (codewords[uVar18] & 0xfffffc00) + uVar17;
        codewords[uVar18] = (codewords[uVar18] & 0x3ff) + iVar7;
        uVar18 = uVar8;
        uVar16 = uVar9;
      }
      else {
        uVar17 = (codewords[uVar16] & 0xfffffc00) + (codewords[uVar9] & 0xfffffc00);
        uVar16 = uVar16 + 2;
      }
LAB_00107852:
      codewords[uVar19] = codewords[uVar19] & 0x3ff | uVar17;
      uVar19 = uVar19 + 1;
      iVar7 = iVar7 + 0x400;
    } while (uVar13 != uVar19);
    uVar18 = (ulong)max_codeword_len;
    for (lVar10 = 0; uVar18 + 1 != lVar10; lVar10 = lVar10 + 1) {
      len_counts[lVar10] = 0;
    }
    uVar19 = (ulong)(uVar14 - 2);
    len_counts[1] = 2;
    codewords[uVar19] = codewords[uVar19] & 0x3ff;
    while( true ) {
      uVar19 = uVar19 - 1;
      if ((int)(uint)uVar19 < 0) break;
      uVar13 = (uint)uVar19 & 0x7fffffff;
      uVar14 = codewords[codewords[uVar13] >> 10] >> 10;
      uVar8 = (ulong)uVar14 + 1;
      codewords[uVar13] = (uint)uVar8 << 10 | codewords[uVar13] & 0x3ff;
      uVar13 = max_codeword_len + 1;
      if ((uint)uVar8 < max_codeword_len) {
        uVar16 = len_counts[(ulong)uVar14 + 1];
        uVar13 = uVar14 + 2;
      }
      else {
        do {
          uVar8 = (ulong)(uVar13 - 2);
          uVar16 = len_counts[uVar8];
          uVar13 = uVar13 - 1;
        } while (uVar16 == 0);
      }
      len_counts[uVar8] = uVar16 - 1;
      len_counts[uVar13] = len_counts[uVar13] + 2;
    }
    uVar13 = 0;
    uVar19 = uVar18;
    while (uVar8 = uVar19, uVar8 != 0) {
      uVar14 = len_counts[uVar8];
      while (bVar20 = uVar14 != 0, uVar14 = uVar14 - 1, uVar19 = uVar8 - 1, bVar20) {
        uVar19 = (ulong)uVar13;
        uVar13 = uVar13 + 1;
        lens[codewords[uVar19] & 0x3ff] = (u8)uVar8;
      }
    }
    local_4b8[0] = 0;
    local_4b8[1] = 0;
    for (uVar19 = 2; uVar19 <= uVar18; uVar19 = uVar19 + 1) {
      local_4b8[uVar19] = (len_counts[uVar19 - 1] + len_counts[uVar19 + 0xf]) * 2;
    }
    for (uVar18 = 0; uVar12 != uVar18; uVar18 = uVar18 + 1) {
      bVar2 = lens[uVar18];
      uVar13 = local_4b8[bVar2];
      uVar3 = ""[uVar13 & 0xff];
      uVar4 = ""[uVar13 >> 8];
      local_4b8[bVar2] = uVar13 + 1;
      codewords[uVar18] = (uint)(ushort)(CONCAT11(uVar3,uVar4) >> (0x10 - bVar2 & 0x1f));
    }
  }
  return;
}

Assistant:

static void
deflate_make_huffman_code(unsigned num_syms, unsigned max_codeword_len,
			  const u32 freqs[], u8 lens[], u32 codewords[])
{
	u32 *A = codewords;
	unsigned num_used_syms;

	STATIC_ASSERT(DEFLATE_MAX_NUM_SYMS <= 1 << NUM_SYMBOL_BITS);
	STATIC_ASSERT(MAX_BLOCK_LENGTH <= ((u32)1 << NUM_FREQ_BITS) - 1);

	/*
	 * We begin by sorting the symbols primarily by frequency and
	 * secondarily by symbol value.  As an optimization, the array used for
	 * this purpose ('A') shares storage with the space in which we will
	 * eventually return the codewords.
	 */
	num_used_syms = sort_symbols(num_syms, freqs, lens, A);
	/*
	 * 'num_used_syms' is the number of symbols with nonzero frequency.
	 * This may be less than @num_syms.  'num_used_syms' is also the number
	 * of entries in 'A' that are valid.  Each entry consists of a distinct
	 * symbol and a nonzero frequency packed into a 32-bit integer.
	 */

	/*
	 * A complete Huffman code must contain at least 2 codewords.  Yet, it's
	 * possible that fewer than 2 symbols were used.  When this happens,
	 * it's usually for the offset code (0-1 symbols used).  But it's also
	 * theoretically possible for the litlen and pre codes (1 symbol used).
	 *
	 * The DEFLATE RFC explicitly allows the offset code to contain just 1
	 * codeword, or even be completely empty.  But it's silent about the
	 * other codes.  It also doesn't say whether, in the 1-codeword case,
	 * the codeword (which it says must be 1 bit) is '0' or '1'.
	 *
	 * In any case, some DEFLATE decompressors reject these cases.  zlib
	 * generally allows them, but it does reject precodes that have just 1
	 * codeword.  More problematically, zlib v1.2.1 and earlier rejected
	 * empty offset codes, and this behavior can also be seen in Windows
	 * Explorer's ZIP unpacker (supposedly even still in Windows 11).
	 *
	 * Other DEFLATE compressors, including zlib, always send at least 2
	 * codewords in order to make a complete Huffman code.  Therefore, this
	 * is a case where practice does not entirely match the specification.
	 * We follow practice by generating 2 codewords of length 1: codeword
	 * '0' for symbol 0, and codeword '1' for another symbol -- the used
	 * symbol if it exists and is not symbol 0, otherwise symbol 1.  This
	 * does worsen the compression ratio by having to send an unnecessary
	 * offset codeword length.  But this only affects rare cases such as
	 * blocks containing all literals, and it only makes a tiny difference.
	 */
	if (unlikely(num_used_syms < 2)) {
		unsigned sym = num_used_syms ? (A[0] & SYMBOL_MASK) : 0;
		unsigned nonzero_idx = sym ? sym : 1;

		codewords[0] = 0;
		lens[0] = 1;
		codewords[nonzero_idx] = 1;
		lens[nonzero_idx] = 1;
		return;
	}

	/*
	 * Build a stripped-down version of the Huffman tree, sharing the array
	 * 'A' with the symbol values.  Then extract length counts from the tree
	 * and use them to generate the final codewords.
	 */

	build_tree(A, num_used_syms);

	{
		unsigned len_counts[DEFLATE_MAX_CODEWORD_LEN + 1];

		compute_length_counts(A, num_used_syms - 2,
				      len_counts, max_codeword_len);

		gen_codewords(A, lens, len_counts, max_codeword_len, num_syms);
	}
}